

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::BlendShape>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,BlendShape *bs,
               string *warn,string *err,PrimReconstructOptions *options)

{
  size_type *psVar1;
  Attribute *this;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string *this_00;
  size_type sVar5;
  ulong uVar6;
  ostringstream oVar7;
  int iVar8;
  ostream *poVar9;
  long *plVar10;
  long lVar11;
  const_iterator cVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  char *pcVar15;
  long *plVar16;
  size_type __n;
  Property *pPVar17;
  bool bVar18;
  string attr_type_name;
  ParseResult ret;
  char *kPointIndices;
  char *kNormalOffsets;
  char *kOffsets;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
  *in_stack_fffffffffffffcc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  undefined1 local_328 [16];
  pointer local_318;
  string local_310;
  string *local_2f0;
  undefined1 local_2e8 [8];
  _Alloc_hider local_2e0;
  undefined1 local_2d8 [24];
  AttrMetas *local_2c0;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  optional<std::vector<int,std::allocator<int>>> *local_290;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_288;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_280;
  string *local_278;
  string *local_270;
  _Base_ptr local_268;
  long *local_260;
  ulong local_258;
  long local_250 [2];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  undefined8 local_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1a8 [6];
  ios_base local_148 [16];
  ios_base local_138 [264];
  
  local_230._0_8_ = "offsets";
  local_240._8_8_ = "normalOffsets";
  local_240._0_8_ = "pointIndices";
  local_210 = &local_220;
  local_220._M_allocated_capacity._0_4_ = 0;
  local_220._8_8_ = (_Link_type)0x0;
  local_200 = 0;
  p_Var14 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_268 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar18 = true;
  local_208 = local_210;
  if (p_Var14 != local_268) {
    local_270 = (string *)&bs->offsets;
    local_278 = (string *)&bs->normalOffsets;
    local_2c0 = &(bs->pointIndices)._metas;
    local_288 = &(bs->pointIndices)._paths;
    local_290 = (optional<std::vector<int,std::allocator<int>>> *)&(bs->pointIndices)._attrib;
    local_280 = &bs->props;
    local_2f0 = err;
    do {
      local_1d8[0] = local_1c8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d8,*(long *)(p_Var14 + 1),
                 (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
      this = (Attribute *)(p_Var14 + 2);
      local_1b8._0_8_ = local_1b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"offsets","");
      pPVar17 = (Property *)local_1b8;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                ((ParseResult *)local_2e8,(_anonymous_namespace_ *)(local_230 + 8),
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1d8,(string *)this,(Property *)local_1b8,local_270,
                 in_stack_fffffffffffffcc8);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(aaStack_1a8[0]._M_allocated_capacity + 1));
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      iVar8 = 0;
      if (((ulong)local_2e8 & 0xfffffffd) == 0) {
        iVar8 = 3;
LAB_001fccb0:
        bVar18 = false;
      }
      else {
        bVar18 = true;
        if (local_2e8._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbd2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_328 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_330,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char_const*,std::__cxx11::string>
                    (&local_310,(fmt *)&local_330,(string *)local_230,&local_2e0._M_p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar17);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1b8,local_310._M_dataplus._M_p,
                              local_310._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          if (local_330 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_328 + 8)) {
            operator_delete(local_330,(ulong)((long)&((_Alloc_hider *)local_328._8_8_)->_M_p + 1));
          }
          if (local_2f0 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar10 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)&local_330,(ulong)(local_2f0->_M_dataplus)._M_p);
            psVar1 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar1) {
              local_310.field_2._M_allocated_capacity = *psVar1;
              local_310.field_2._8_8_ = plVar10[3];
              local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
            }
            else {
              local_310.field_2._M_allocated_capacity = *psVar1;
              local_310._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_310._M_string_length = plVar10[1];
            *plVar10 = (long)psVar1;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_2f0,(string *)&local_310);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_330 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_328 + 8)) {
              operator_delete(local_330,(ulong)((long)&((_Alloc_hider *)local_328._8_8_)->_M_p + 1))
              ;
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          ::std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x70));
          iVar8 = 1;
          goto LAB_001fccb0;
        }
      }
      if (local_2e0._M_p != local_2d8 + 8) {
        operator_delete(local_2e0._M_p,local_2d8._8_8_ + 1);
      }
      if (bVar18) {
        local_1f8[0] = local_1e8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,*(long *)(p_Var14 + 1),
                   (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
        local_1b8._0_8_ = local_1b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"normalOffsets","");
        pPVar17 = (Property *)local_1b8;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                  ((ParseResult *)local_2e8,(_anonymous_namespace_ *)(local_230 + 8),
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1f8,(string *)this,(Property *)local_1b8,local_278,
                   in_stack_fffffffffffffcc8);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(aaStack_1a8[0]._M_allocated_capacity + 1))
          ;
        }
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0],local_1e8[0] + 1);
        }
        iVar8 = 0;
        if (((ulong)local_2e8 & 0xfffffffd) == 0) {
          iVar8 = 3;
LAB_001fcfc0:
          bVar18 = false;
        }
        else {
          bVar18 = true;
          if (local_2e8._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbd3);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_328 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_330,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char_const*,std::__cxx11::string>
                      (&local_310,(fmt *)&local_330,(string *)(local_240 + 8),&local_2e0._M_p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar17)
            ;
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1b8,local_310._M_dataplus._M_p,
                                local_310._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_330 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_328 + 8)) {
              operator_delete(local_330,(ulong)((long)&((_Alloc_hider *)local_328._8_8_)->_M_p + 1))
              ;
            }
            if (local_2f0 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar10 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_330,(ulong)(local_2f0->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_310.field_2._M_allocated_capacity = *psVar1;
                local_310.field_2._8_8_ = plVar10[3];
                local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
              }
              else {
                local_310.field_2._M_allocated_capacity = *psVar1;
                local_310._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_310._M_string_length = plVar10[1];
              *plVar10 = (long)psVar1;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_2f0,(string *)&local_310);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != &local_310.field_2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              if (local_330 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_328 + 8)) {
                operator_delete(local_330,
                                (ulong)((long)&((_Alloc_hider *)local_328._8_8_)->_M_p + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x70));
            iVar8 = 1;
            goto LAB_001fcfc0;
          }
        }
        if (local_2e0._M_p != local_2d8 + 8) {
          operator_delete(local_2e0._M_p,local_2d8._8_8_ + 1);
        }
        if (!bVar18) goto LAB_001fd954;
        local_260 = local_250;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_260,*(long *)(p_Var14 + 1),
                   (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"pointIndices","");
        uVar6 = local_258;
        sVar5 = local_2b8._M_string_length;
        local_2e0._M_p = local_2d8 + 8;
        local_2d8._0_8_ = (char *)0x0;
        local_2d8._8_8_ = local_2d8._8_8_ & 0xffffffffffffff00;
        __n = local_258;
        if (local_2b8._M_string_length < local_258) {
          __n = local_2b8._M_string_length;
        }
        if (__n == 0) {
          if (local_258 == local_2b8._M_string_length) goto LAB_001fd09e;
LAB_001fd125:
          local_2e8._0_4_ = 1;
        }
        else {
          iVar8 = bcmp(local_260,local_2b8._M_dataplus._M_p,__n);
          if ((uVar6 != sVar5) || (iVar8 != 0)) goto LAB_001fd125;
LAB_001fd09e:
          Attribute::type_name_abi_cxx11_(&local_310,this);
          tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::type_name_abi_cxx11_();
          pcVar15 = (char *)local_1b8._0_8_;
          if ((local_1b8._8_8_ != local_310._M_string_length) ||
             ((bVar18 = true,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._8_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 &&
              (iVar8 = bcmp((void *)local_1b8._0_8_,local_310._M_dataplus._M_p,local_1b8._8_8_),
              iVar8 != 0)))) {
            tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::
            underlying_type_name_abi_cxx11_();
            paVar4 = local_330;
            if (local_328._0_8_ == local_310._M_string_length) {
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_328._0_8_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                bVar18 = true;
              }
              else {
                iVar8 = bcmp(local_330,local_310._M_dataplus._M_p,local_328._0_8_);
                bVar18 = iVar8 == 0;
              }
            }
            else {
              bVar18 = false;
            }
            pcVar15 = (char *)local_1b8._0_8_;
            if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_328 + 8)) {
              operator_delete(paVar4,(ulong)((long)&((_Alloc_hider *)local_328._8_8_)->_M_p + 1));
              pcVar15 = (char *)local_1b8._0_8_;
            }
          }
          if (pcVar15 != local_1b8 + 0x10) {
            operator_delete(pcVar15,(ulong)(aaStack_1a8[0]._M_allocated_capacity + 1));
          }
          if (bVar18) {
            p_Var2 = p_Var14[6]._M_parent;
            p_Var3 = p_Var14[6]._M_left;
            if (p_Var3 != p_Var2) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_288,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var14[6]._M_parent);
            }
            iVar8 = *(int *)((long)&p_Var14[0x17]._M_parent + 4);
            if (iVar8 == 0) {
              lVar11 = 0x208;
LAB_001fd349:
              (&(((AttrMeta *)&local_2c0->interpolation)->interpolation).has_value_)[lVar11] = true;
LAB_001fd4ae:
              AttrMetas::operator=(local_2c0,(AttrMetas *)(p_Var14 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)(local_230 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2b8);
              local_2e8 = (undefined1  [8])((ulong)local_2e8 & 0xffffffff00000000);
            }
            else {
              if (iVar8 == 1) {
                if (p_Var14[3]._M_color != _S_black) {
                  local_2e8._0_4_ = 4;
                  local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(local_328 + 8);
                  local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x2d;
                  local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)::std::__cxx11::string::_M_create
                                           ((ulong *)&local_330,(ulong)&local_298);
                  local_328._8_8_ = local_298;
                  local_330->_M_allocated_capacity = 0x7475626972747441;
                  *(char *)((long)local_330 + 8) = 'e';
                  *(char *)((long)local_330 + 9) = ' ';
                  *(char *)((long)local_330 + 10) = '`';
                  *(char *)((long)local_330 + 0xb) = '{';
                  *(char *)((long)local_330 + 0xc) = '}';
                  *(char *)((long)local_330 + 0xd) = '`';
                  *(char *)((long)local_330 + 0xe) = ' ';
                  *(char *)((long)local_330 + 0xf) = 'm';
                  *(char *)((long)local_330 + 0x10) = 'u';
                  *(char *)((long)local_330 + 0x11) = 's';
                  *(char *)((long)local_330 + 0x12) = 't';
                  *(char *)((long)local_330 + 0x13) = ' ';
                  *(char *)((long)local_330 + 0x14) = 'b';
                  *(char *)((long)local_330 + 0x15) = 'e';
                  *(char *)((long)local_330 + 0x16) = ' ';
                  *(char *)((long)local_330 + 0x17) = '`';
                  *(char *)((long)local_330 + 0x18) = 'u';
                  *(char *)((long)local_330 + 0x19) = 'n';
                  *(char *)((long)local_330 + 0x1a) = 'i';
                  *(char *)((long)local_330 + 0x1b) = 'f';
                  *(char *)((long)local_330 + 0x1c) = 'o';
                  *(char *)((long)local_330 + 0x1d) = 'r';
                  *(char *)((long)local_330 + 0x1e) = 'm';
                  *(char *)((long)local_330 + 0x1f) = '`';
                  *(char *)((long)local_330 + 0x1d) = 'r';
                  *(char *)((long)local_330 + 0x1e) = 'm';
                  *(char *)((long)local_330 + 0x1f) = '`';
                  *(char *)((long)local_330 + 0x20) = ' ';
                  *(char *)((long)local_330 + 0x21) = 'v';
                  *(char *)((long)local_330 + 0x22) = 'a';
                  *(char *)((long)local_330 + 0x23) = 'r';
                  *(char *)((long)local_330 + 0x24) = 'i';
                  *(char *)((long)local_330 + 0x25) = 'a';
                  *(char *)((long)local_330 + 0x26) = 'b';
                  *(char *)((long)local_330 + 0x27) = 'i';
                  *(char *)((long)local_330 + 0x28) = 'l';
                  *(char *)((long)local_330 + 0x29) = 'i';
                  *(char *)((long)local_330 + 0x2a) = 't';
                  *(char *)((long)local_330 + 0x2b) = 'y';
                  *(char *)((long)local_330 + 0x2c) = '.';
                  local_328._0_8_ = local_298;
                  local_330->_M_local_buf[(long)local_298] = '\0';
                  fmt::format<std::__cxx11::string>
                            ((string *)local_1b8,(fmt *)&local_330,&local_2b8,local_298);
                  ::std::__cxx11::string::operator=((string *)&local_2e0,(string *)local_1b8);
                  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
                    operator_delete((void *)local_1b8._0_8_,
                                    (ulong)(aaStack_1a8[0]._M_allocated_capacity + 1));
                  }
                  if (local_330 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_328 + 8)) {
                    operator_delete(local_330,
                                    (ulong)((long)&((_Alloc_hider *)local_328._8_8_)->_M_p + 1));
                  }
                  goto LAB_001fd500;
                }
                if (p_Var14[5]._M_left == p_Var14[5]._M_parent) {
                  if (p_Var14[4]._M_right == (_Base_ptr)0x0) {
                    bVar18 = false;
                  }
                  else {
                    iVar8 = (**(code **)p_Var14[4]._M_right)();
                    bVar18 = iVar8 == 4;
                  }
                  lVar11 = 0x248;
                  if ((bVar18) || ((p_Var14[5]._M_color & _S_black) != _S_red)) goto LAB_001fd349;
                  if ((p_Var14[4]._M_right != (_Base_ptr)0x0) &&
                     ((iVar8 = (**(code **)p_Var14[4]._M_right)(), iVar8 == 0 ||
                      ((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                       (iVar8 = (**(code **)p_Var14[4]._M_right)(), iVar8 == 1))))))
                  goto LAB_001fd4a1;
                  primvar::PrimVar::get_value<std::vector<int,std::allocator<int>>>
                            ((optional<std::vector<int,_std::allocator<int>_>_> *)local_1b8,
                             (PrimVar *)&p_Var14[4]._M_parent);
                  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_1b8._0_8_;
                  oVar7 = local_1b8[0];
                  if (local_1b8[0] == (ostringstream)0x1) {
                    local_328._0_8_ = local_1b8._8_8_;
                    local_328._8_8_ = aaStack_1a8[0]._M_allocated_capacity;
                    local_318 = (pointer)aaStack_1a8[0]._8_8_;
                    local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_330._1_7_,1);
                    nonstd::optional_lite::optional<std::vector<int,std::allocator<int>>>::operator=
                              (local_290,(vector<int,_std::allocator<int>_> *)local_328);
                    paVar4 = local_330;
                  }
                  else {
                    local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_330._1_7_,local_1b8[0]);
                    local_2e8._0_4_ = 4;
                    ::std::__cxx11::string::operator=
                              ((string *)&local_2e0,"Internal data corrupsed.");
                  }
                  if ((((ulong)paVar4 & 1) != 0) &&
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_328._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                    operator_delete((void *)local_328._0_8_,(long)local_318 - local_328._0_8_);
                  }
                  if (oVar7 == (ostringstream)0x0) goto LAB_001fd500;
                  goto LAB_001fd4ae;
                }
                local_2e8._0_4_ = 4;
                pPVar17 = (Property *)0x58;
                pcVar15 = 
                "TimeSample or corrupted value assigned to a property where `uniform` variability is set."
                ;
              }
              else {
LAB_001fd4a1:
                if (p_Var3 != p_Var2) goto LAB_001fd4ae;
                local_2e8._0_4_ = 8;
                pPVar17 = (Property *)0x18;
                pcVar15 = "Internal data corrupsed.";
              }
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_2e0,0,(char *)local_2d8._0_8_,(ulong)pcVar15);
            }
          }
          else {
            local_2e8._0_4_ = 3;
            ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_1b8 + 0x10),"Property type mismatch. ",0x18);
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)(local_1b8 + 0x10),local_2b8._M_dataplus._M_p,
                                local_2b8._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," expects type `",0xf);
            tinyusdz::value::TypeTraits<std::vector<int,std::allocator<int>>>::type_name_abi_cxx11_
                      ();
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_330->_M_local_buf,local_328._0_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"` but defined as type `",0x17);
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_310._M_dataplus._M_p,local_310._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`",1);
            if (local_330 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_328 + 8)) {
              operator_delete(local_330,(ulong)((long)&((_Alloc_hider *)local_328._8_8_)->_M_p + 1))
              ;
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::operator=((string *)&local_2e0,(string *)&local_330);
            if (local_330 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_328 + 8)) {
              operator_delete(local_330,(ulong)((long)&((_Alloc_hider *)local_328._8_8_)->_M_p + 1))
              ;
            }
            ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            ::std::ios_base::~ios_base(local_138);
          }
LAB_001fd500:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if (local_260 != local_250) {
          operator_delete(local_260,local_250[0] + 1);
        }
        iVar8 = 0;
        if (((ulong)local_2e8 & 0xfffffffd) == 0) {
          iVar8 = 3;
LAB_001fd796:
          bVar18 = false;
        }
        else {
          bVar18 = true;
          if (local_2e8._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((Property *)local_1b8,0xbd4);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_328 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_330,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char_const*,std::__cxx11::string>
                      (&local_310,(fmt *)&local_330,(string *)local_240,&local_2e0._M_p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar17)
            ;
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1b8,local_310._M_dataplus._M_p,
                                local_310._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_330 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_328 + 8)) {
              operator_delete(local_330,(ulong)((long)&((_Alloc_hider *)local_328._8_8_)->_M_p + 1))
              ;
            }
            if (local_2f0 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar10 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_330,(ulong)(local_2f0->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_310.field_2._M_allocated_capacity = *psVar1;
                local_310.field_2._8_8_ = plVar10[3];
                local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
              }
              else {
                local_310.field_2._M_allocated_capacity = *psVar1;
                local_310._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_310._M_string_length = plVar10[1];
              *plVar10 = (long)psVar1;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_2f0,(string *)&local_310);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_310._M_dataplus._M_p != &local_310.field_2) {
                operator_delete(local_310._M_dataplus._M_p,
                                local_310.field_2._M_allocated_capacity + 1);
              }
              if (local_330 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_328 + 8)) {
                operator_delete(local_330,
                                (ulong)((long)&((_Alloc_hider *)local_328._8_8_)->_M_p + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            ::std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x70));
            iVar8 = 1;
            goto LAB_001fd796;
          }
        }
        if (local_2e0._M_p != local_2d8 + 8) {
          operator_delete(local_2e0._M_p,local_2d8._8_8_ + 1);
        }
        if (!bVar18) goto LAB_001fd954;
        p_Var2 = p_Var14 + 1;
        cVar12 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_230 + 8),(key_type *)p_Var2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cVar12._M_node == &local_220) {
          pmVar13 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](local_280,(key_type *)p_Var2);
          ::std::__cxx11::string::_M_assign((string *)pmVar13);
          (pmVar13->_attrib)._varying_authored = (bool)p_Var14[3].field_0x4;
          (pmVar13->_attrib)._variability = p_Var14[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar13->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar13->_attrib)._var,(any *)&p_Var14[4]._M_parent);
          (pmVar13->_attrib)._var._blocked = SUB41(p_Var14[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=(&(pmVar13->_attrib)._var._ts._samples,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var14[5]._M_parent);
          (pmVar13->_attrib)._var._ts._dirty = SUB41(p_Var14[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar13->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var14[6]._M_parent);
          AttrMetas::operator=(&(pmVar13->_attrib)._metas,(AttrMetas *)(p_Var14 + 7));
          *(_Base_ptr *)&pmVar13->_listOpQual = p_Var14[0x17]._M_parent;
          (pmVar13->_rel).type = *(Type *)&p_Var14[0x17]._M_left;
          Path::operator=(&(pmVar13->_rel).targetPath,(Path *)&p_Var14[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &(pmVar13->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var14[0x1e]._M_parent);
          (pmVar13->_rel).listOpQual = p_Var14[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar13->_rel)._metas,(AttrMetas *)&p_Var14[0x1f]._M_parent);
          (pmVar13->_rel)._varying_authored = *(bool *)&p_Var14[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar13->_prop_value_type_name);
          pmVar13->_has_custom = *(bool *)&p_Var14[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)(local_230 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var2);
        }
        cVar12 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_230 + 8),(key_type *)p_Var2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cVar12._M_node == &local_220) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b8,0xbd6);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e8,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var2);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1b8,(char *)local_2e8,(long)local_2e0._M_p);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if (local_2e8 != (undefined1  [8])local_2d8) {
            operator_delete((void *)local_2e8,(ulong)(local_2d8._0_8_ + 1));
          }
          this_00 = local_2f0;
          if (local_2f0 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar10 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)&local_310,(ulong)(this_00->_M_dataplus)._M_p);
            plVar16 = plVar10 + 2;
            if ((long *)*plVar10 == plVar16) {
              local_2d8._0_8_ = *plVar16;
              local_2d8._8_8_ = plVar10[3];
              local_2e8 = (undefined1  [8])local_2d8;
            }
            else {
              local_2d8._0_8_ = *plVar16;
              local_2e8 = (undefined1  [8])*plVar10;
            }
            local_2e0._M_p = (pointer)plVar10[1];
            *plVar10 = (long)plVar16;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)this_00,(string *)local_2e8);
            if (local_2e8 != (undefined1  [8])local_2d8) {
              operator_delete((void *)local_2e8,(ulong)(local_2d8._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          ::std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x70));
          goto LAB_001fdbef;
        }
      }
      else {
LAB_001fd954:
        if ((iVar8 != 3) && (iVar8 != 0)) {
LAB_001fdbef:
          bVar18 = false;
          goto LAB_001fdbf1;
        }
      }
      p_Var14 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14);
    } while (p_Var14 != local_268);
    bVar18 = true;
  }
LAB_001fdbf1:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_230 + 8),(_Link_type)local_220._8_8_);
  return bVar18;
}

Assistant:

bool ReconstructPrim<BlendShape>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    BlendShape *bs,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)spec;
  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct BlendShape");

  constexpr auto kOffsets = "offsets";
  constexpr auto kNormalOffsets = "normalOffsets";
  constexpr auto kPointIndices = "pointIndices";

  std::set<std::string> table;
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, kOffsets, BlendShape, bs->offsets)
    PARSE_TYPED_ATTRIBUTE(table, prop, kNormalOffsets, BlendShape, bs->normalOffsets)
    PARSE_TYPED_ATTRIBUTE(table, prop, kPointIndices, BlendShape, bs->pointIndices)
    ADD_PROPERTY(table, prop, Skeleton, bs->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

#if 0 // TODO: Check required properties exist in strict mode.
  // `offsets` and `normalOffsets` are required property
  if (!table.count(kOffsets)) {
    PUSH_ERROR_AND_RETURN("`offsets` property is missing. `uniform vector3f[] offsets` is a required property.");
  }
  if (!table.count(kNormalOffsets)) {
    PUSH_ERROR_AND_RETURN("`normalOffsets` property is missing. `uniform vector3f[] normalOffsets` is a required property.");
  }
#endif

  return true;
}